

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void __thiscall L12_1::String::String(String *this)

{
  char *pcVar1;
  
  this->_length = 0;
  pcVar1 = (char *)operator_new__(1);
  this->_p_str = pcVar1;
  *pcVar1 = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"init as default...",0x12);
  num_strings = num_strings + 1;
  return;
}

Assistant:

String::String() {
        //  空字符串是 '\0'
        _length = 0;
        _p_str = new char[_length + 1];
        _p_str[0] = '\0';

        std::cout << "init as default...";
        num_strings++;
    }